

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

Am_Object put_objects_into_group
                    (Am_Value_List *selected_objs,Am_Value_List *selected_objs_places,
                    Am_Object *group,Am_Object *new_group)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Wrapper *value;
  Am_Object *pAVar7;
  Am_Object *in_R8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Value_List local_a8;
  Am_Value_List local_98;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78 [3];
  undefined1 local_59;
  Am_Object local_58;
  Am_Object obj;
  int bottom;
  int right;
  int top_offset;
  int left_offset;
  int height;
  int width;
  int top;
  int left;
  Am_Object *new_group_local;
  Am_Object *group_local;
  Am_Value_List *selected_objs_places_local;
  Am_Value_List *selected_objs_local;
  Am_Object *place;
  
  right = 9999;
  bottom = 9999;
  obj.data._4_4_ = -9999;
  obj.data._0_4_ = -9999;
  Am_Object::Am_Object(&local_58);
  local_59 = 0;
  Am_Object::Am_Object((Am_Object *)selected_objs);
  Am_Value_List::Start(selected_objs_places);
  while (bVar1 = Am_Value_List::Last(selected_objs_places), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar6 = Am_Value_List::Get(selected_objs_places);
    Am_Object::operator=(&local_58,pAVar6);
    pAVar6 = Am_Object::Get(&local_58,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&local_58,0x65,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&local_58,0x66,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&local_58,0x67,0);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    if (iVar2 < right) {
      right = iVar2;
    }
    if (iVar3 < bottom) {
      bottom = iVar3;
    }
    if (obj.data._4_4_ < iVar2 + iVar4) {
      obj.data._4_4_ = iVar2 + iVar4;
    }
    if ((int)obj.data < iVar3 + iVar5) {
      obj.data._0_4_ = iVar3 + iVar5;
    }
    Am_Object::Am_Object(&local_80,&local_58);
    Am_Object::Am_Object(&local_88,new_group);
    Am_Find_Part_Place(local_78,&local_80);
    Am_Object::operator=((Am_Object *)selected_objs,local_78);
    Am_Object::~Am_Object(local_78);
    Am_Object::~Am_Object(&local_88);
    Am_Object::~Am_Object(&local_80);
    value = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)selected_objs);
    Am_Value_List::Add((Am_Value_List *)group,value,Am_TAIL,true);
    Am_Value_List::Next(selected_objs_places);
  }
  pAVar7 = Am_Object::Set(in_R8,100,right,0);
  pAVar7 = Am_Object::Set(pAVar7,0x65,bottom,0x20000);
  pAVar7 = Am_Object::Set(pAVar7,0x66,obj.data._4_4_ - right,0x20000);
  Am_Object::Set(pAVar7,0x67,(int)obj.data - bottom,0x20000);
  Am_Value_List::Am_Value_List(&local_98,selected_objs_places);
  adjust_objects_positions(&local_98,-right,-bottom);
  Am_Value_List::~Am_Value_List(&local_98);
  Am_Value_List::Am_Value_List(&local_a8,selected_objs_places);
  Am_Object::Am_Object(&local_b0,new_group);
  Am_Object::Am_Object(&local_b8,in_R8);
  Am_Object::Am_Object(&local_c0,&Am_No_Object);
  remove_and_add_objects(&local_a8,&local_b0,&local_b8,&local_c0);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_b0);
  Am_Value_List::~Am_Value_List(&local_a8);
  local_59 = 1;
  Am_Object::~Am_Object(&local_58);
  return (Am_Object)(Am_Object_Data *)selected_objs;
}

Assistant:

Am_Object
put_objects_into_group(Am_Value_List selected_objs,
                       Am_Value_List &selected_objs_places, Am_Object group,
                       Am_Object new_group)
{
  int left, top, width, height;
  int left_offset = 9999;
  int top_offset = 9999;
  int right = -9999;
  int bottom = -9999;
  Am_Object obj, place;
  for (selected_objs.Start(); !selected_objs.Last(); selected_objs.Next()) {
    obj = selected_objs.Get();
    left = obj.Get(Am_LEFT);
    top = obj.Get(Am_TOP);
    width = obj.Get(Am_WIDTH);
    height = obj.Get(Am_HEIGHT);
    if (left < left_offset)
      left_offset = left;
    if (top < top_offset)
      top_offset = top;
    if (left + width > right)
      right = left + width;
    if (top + height > bottom)
      bottom = top + height;
    place = Am_Find_Part_Place(obj, group);
    selected_objs_places.Add(place);
  }
  new_group.Set(Am_LEFT, left_offset)
      .Set(Am_TOP, top_offset, Am_NO_ANIMATION)
      .Set(Am_WIDTH, right - left_offset, Am_NO_ANIMATION)
      .Set(Am_HEIGHT, bottom - top_offset, Am_NO_ANIMATION);
  adjust_objects_positions(selected_objs, -left_offset, -top_offset);
  remove_and_add_objects(selected_objs, group, new_group);
  return place;
}